

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

bool __thiscall Potassco::TheoryData::hasTerm(TheoryData *this,Id_t id)

{
  if (id < (uint)((this->data_->terms).top >> 3)) {
    return *(long *)((long)(this->data_->terms).mem.beg_ + (ulong)id * 8) != -1;
  }
  return false;
}

Assistant:

uint32_t TheoryData::numTerms() const {
	return data_->terms.size();
}